

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::Utils::Variable::Descriptor::GetDefinition_abi_cxx11_
          (string *__return_storage_ptr__,Descriptor *this,FLAVOUR flavour,STORAGE storage)

{
  anon_union_16_2_8d0b6f57_for_Descriptor_9 *this_00;
  Interface *this_01;
  pointer text;
  TestError *pTVar1;
  bool *text_00;
  size_t position;
  char buffer [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  position = 0;
  if (INDEXED_BY_INVOCATION_ID < flavour) {
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invliad enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xf9b);
LAB_00959e94:
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  if ((this->m_type != BUILTIN) && ((this->field_9).m_interface == (Interface *)0x0)) {
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Nullptr",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xfa3);
    goto LAB_00959e94;
  }
  if ((this->m_qualifiers)._M_string_length == 0) {
    replaceToken("QUALIFIERS ",&position,glcts::fixed_sample_locations_values + 1,
                 __return_storage_ptr__);
  }
  else {
    replaceToken("QUALIFIERS",&position,(this->m_qualifiers)._M_dataplus._M_p,__return_storage_ptr__
                );
  }
  this_00 = &this->field_9;
  text_00 = (bool *)0x169b0c9;
  if (((this->m_type != BUILTIN) && (this_00->m_interface != (Interface *)0x0)) &&
     (text_00 = (bool *)0x169b0c9,
     ((((this_00->m_interface->m_members).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
        ._M_impl.super__Vector_impl_data._M_start)->field_9).m_builtin.m_basic_type & 0xfffffffe) ==
     2)) {
    text_00 = (bool *)0x1676d94;
  }
  switch(storage) {
  case VARYING_INPUT:
    break;
  case VARYING_OUTPUT:
    text_00 = (bool *)0x169b185;
    break;
  case UNIFORM:
    text_00 = (bool *)0x169d731;
    break;
  case SSB:
    text_00 = (bool *)0x17cc114;
    break;
  case MEMBER:
    text_00 = glcts::fixed_sample_locations_values + 1;
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0xfce);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  replaceToken("STORAGE",&position,text_00,__return_storage_ptr__);
  if (this->m_type == BUILTIN) {
    text = Utils::Type::GetGLSLTypeName(&this_00->m_builtin);
  }
  else {
    this_01 = this_00->m_interface;
    if (this_01->m_type != STRUCT) {
      Interface::GetDefinition_abi_cxx11_((string *)buffer,this_01);
      replaceToken("TYPE",&position,(GLchar *)buffer._0_8_,__return_storage_ptr__);
      std::__cxx11::string::~string((string *)buffer);
      goto LAB_00959dc8;
    }
    text = (this_01->m_name)._M_dataplus._M_p;
  }
  replaceToken("TYPE",&position,text,__return_storage_ptr__);
LAB_00959dc8:
  replaceToken("NAME",&position,(this->m_name)._M_dataplus._M_p,__return_storage_ptr__);
  if (this->m_n_array_elements == 0) {
    replaceToken("ARRAY",&position,glcts::fixed_sample_locations_values + 1,__return_storage_ptr__);
  }
  else {
    sprintf(buffer,"[%d]");
    replaceToken("ARRAY",&position,buffer,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::Descriptor::GetDefinition(FLAVOUR flavour, STORAGE storage) const
{
	static const GLchar* basic_template = "QUALIFIERS STORAGETYPE NAMEARRAY;";
	static const GLchar* array_template = "QUALIFIERS STORAGETYPE NAME[]ARRAY;";
	const GLchar*		 storage_str	= 0;

	std::string definition;
	size_t		position = 0;

	/* Select definition template */
	switch (flavour)
	{
	case BASIC:
		definition = basic_template;
		break;
	case ARRAY:
	case INDEXED_BY_INVOCATION_ID:
		definition = array_template;
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}

	if (BUILTIN != m_type)
	{
		if (0 == m_interface)
		{
			TCU_FAIL("Nullptr");
		}
	}

	/* Qualifiers */
	if (true == m_qualifiers.empty())
	{
		replaceToken("QUALIFIERS ", position, "", definition);
	}
	else
	{
		replaceToken("QUALIFIERS", position, m_qualifiers.c_str(), definition);
	}

	// According to spec: integer or unsigned integer type must always be declared with flat qualifier
	bool flat_qualifier = false;
	if (m_type != BUILTIN && m_interface != NULL)
	{
		if (m_interface->m_members[0].m_builtin.m_basic_type == Utils::Type::Int ||
			m_interface->m_members[0].m_builtin.m_basic_type == Utils::Type::Uint)
		{
			flat_qualifier = true;
		}
	}
	/* Storage */
	switch (storage)
	{
	case VARYING_INPUT:
		storage_str = flat_qualifier ? "flat in " : "in ";
		break;
	case VARYING_OUTPUT:
		storage_str = "out ";
		break;
	case UNIFORM:
		storage_str = "uniform ";
		break;
	case SSB:
		storage_str = "buffer ";
		break;
	case MEMBER:
		storage_str = "";
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	replaceToken("STORAGE", position, storage_str, definition);

	/* Type */
	if (BUILTIN == m_type)
	{
		replaceToken("TYPE", position, m_builtin.GetGLSLTypeName(), definition);
	}
	else
	{
		if (Interface::STRUCT == m_interface->m_type)
		{
			replaceToken("TYPE", position, m_interface->m_name.c_str(), definition);
		}
		else
		{
			const std::string& block_definition = m_interface->GetDefinition();

			replaceToken("TYPE", position, block_definition.c_str(), definition);
		}
	}

	/* Name */
	replaceToken("NAME", position, m_name.c_str(), definition);

	/* Array size */
	if (0 == m_n_array_elements)
	{
		replaceToken("ARRAY", position, "", definition);
	}
	else
	{
		char buffer[16];
		sprintf(buffer, "[%d]", m_n_array_elements);

		replaceToken("ARRAY", position, buffer, definition);
	}

	/* Done */
	return definition;
}